

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O2

int convert_bits(uint8_t *out,size_t *outlen,int outbits,uint8_t *in,size_t inlen,int inbits,int pad
                )

{
  size_t sVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  
  bVar2 = (byte)outbits;
  uVar6 = ~(-1 << (bVar2 & 0x1f));
  uVar4 = 0;
  iVar5 = 0;
  while( true ) {
    bVar7 = inlen == 0;
    inlen = inlen - 1;
    bVar3 = (byte)uVar6;
    if (bVar7) break;
    uVar4 = (uint)*in | uVar4 << ((byte)inbits & 0x1f);
    iVar5 = iVar5 + inbits;
    while (outbits <= iVar5) {
      sVar1 = *outlen;
      *outlen = sVar1 + 1;
      out[sVar1] = (byte)(uVar4 >> ((char)iVar5 - bVar2 & 0x1f)) & bVar3;
      iVar5 = iVar5 - outbits;
    }
    in = in + 1;
  }
  if (pad == 0) {
    if (inbits <= iVar5) {
      return 0;
    }
    if ((uVar4 << (bVar2 - (char)iVar5 & 0x1f) & uVar6) != 0) {
      return 0;
    }
  }
  else if (iVar5 != 0) {
    sVar1 = *outlen;
    *outlen = sVar1 + 1;
    out[sVar1] = (byte)(uVar4 << (bVar2 - (char)iVar5 & 0x1f)) & bVar3;
  }
  return 1;
}

Assistant:

static int convert_bits(uint8_t *out, size_t *outlen, int outbits, const uint8_t *in, size_t inlen, int inbits, int pad) {
    uint32_t val = 0;
    int bits = 0;
    uint32_t maxv = (((uint32_t)1) << outbits) - 1;
    while (inlen--) {
        val = (val << inbits) | *(in++);
        bits += inbits;
        while (bits >= outbits) {
            bits -= outbits;
            out[(*outlen)++] = (val >> bits) & maxv;
        }
    }
    if (pad) {
        if (bits) {
            out[(*outlen)++] = (val << (outbits - bits)) & maxv;
        }
    } else if (((val << (outbits - bits)) & maxv) || bits >= inbits) {
        return 0;
    }
    return 1;
}